

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

void __thiscall Json::Value::Value(Value *this,Value *other)

{
  char *pcVar1;
  size_t sVar2;
  byte bVar3;
  _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
  *this_00;
  size_t sVar4;
  char *__dest;
  undefined8 *puVar5;
  runtime_error *this_01;
  ushort uVar6;
  uint uVar7;
  long lVar8;
  
  bVar3 = (byte)*(ushort *)&other->field_0x8;
  uVar6 = (ushort)*(undefined4 *)&this->field_0x8 & 0xfe00 | *(ushort *)&other->field_0x8 & 0xff;
  *(ushort *)&this->field_0x8 = uVar6;
  this->comments_ = (CommentInfo *)0x0;
  sVar2 = other->limit_;
  this->start_ = other->start_;
  this->limit_ = sVar2;
  if (bVar3 < 8) {
    if ((0x2fU >> (bVar3 & 0x1f) & 1) == 0) {
      if ((0xc0U >> (bVar3 & 0x1f) & 1) == 0) {
        pcVar1 = (other->value_).string_;
        if (pcVar1 == (char *)0x0) {
          (this->value_).int_ = 0;
        }
        else {
          sVar4 = strlen(pcVar1);
          uVar7 = 0x7ffffffe;
          if ((uint)sVar4 < 0x7ffffffe) {
            uVar7 = (uint)sVar4;
          }
          __dest = (char *)malloc((ulong)(uVar7 + 1));
          if (__dest == (char *)0x0) {
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (this_01,
                       "in Json::Value::duplicateStringValue(): Failed to allocate string value buffer"
                      );
            __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          memcpy(__dest,pcVar1,(ulong)uVar7);
          __dest[uVar7] = '\0';
          (this->value_).string_ = __dest;
          uVar6 = uVar6 | 0x100;
        }
        *(ushort *)&this->field_0x8 = uVar6;
      }
      else {
        this_00 = (_Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
                   *)operator_new(0x30);
        std::
        _Rb_tree<Json::Value::CZString,_std::pair<const_Json::Value::CZString,_Json::Value>,_std::_Select1st<std::pair<const_Json::Value::CZString,_Json::Value>_>,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
        ::_Rb_tree(this_00,&((other->value_).map_)->_M_t);
        (this->value_).map_ = (ObjectValues *)this_00;
      }
    }
    else {
      this->value_ = other->value_;
    }
  }
  if (other->comments_ != (CommentInfo *)0x0) {
    puVar5 = (undefined8 *)operator_new__(0x20);
    *puVar5 = 3;
    puVar5[1] = 0;
    puVar5[2] = 0;
    puVar5[3] = 0;
    this->comments_ = (CommentInfo *)(puVar5 + 1);
    lVar8 = 0;
    do {
      pcVar1 = *(char **)((long)&other->comments_->comment_ + lVar8);
      if (pcVar1 != (char *)0x0) {
        CommentInfo::setComment((CommentInfo *)((long)&this->comments_->comment_ + lVar8),pcVar1);
      }
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x18);
  }
  return;
}

Assistant:

Value::Value(const Value& other)
    : type_(other.type_), allocated_(false)
#ifdef JSON_VALUE_USE_INTERNAL_MAP
      ,
      itemIsUsed_(0)
#endif
      ,
      comments_(0), start_(other.start_), limit_(other.limit_) {
  switch (type_) {
  case nullValue:
  case intValue:
  case uintValue:
  case realValue:
  case booleanValue:
    value_ = other.value_;
    break;
  case stringValue:
    if (other.value_.string_) {
      value_.string_ = duplicateStringValue(other.value_.string_);
      allocated_ = true;
    } else {
      value_.string_ = 0;
      allocated_ = false;
    }
    break;
#ifndef JSON_VALUE_USE_INTERNAL_MAP
  case arrayValue:
  case objectValue:
    value_.map_ = new ObjectValues(*other.value_.map_);
    break;
#else
  case arrayValue:
    value_.array_ = arrayAllocator()->newArrayCopy(*other.value_.array_);
    break;
  case objectValue:
    value_.map_ = mapAllocator()->newMapCopy(*other.value_.map_);
    break;
#endif
  default:
    JSON_ASSERT_UNREACHABLE;
  }
  if (other.comments_) {
    comments_ = new CommentInfo[numberOfCommentPlacement];
    for (int comment = 0; comment < numberOfCommentPlacement; ++comment) {
      const CommentInfo& otherComment = other.comments_[comment];
      if (otherComment.comment_)
        comments_[comment].setComment(otherComment.comment_);
    }
  }
}